

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring.cpp
# Opt level: O2

int __thiscall
duckdb::GetBitOperator::Operation<duckdb::string_t,int,int>
          (GetBitOperator *this,string_t input,int n)

{
  int iVar1;
  long lVar2;
  OutOfRangeException *this_00;
  uint __val;
  undefined8 extraout_RDX;
  string_t sVar3;
  string_t sVar4;
  allocator local_81;
  string local_80;
  string local_60;
  string local_40;
  
  sVar4.value._8_8_ = input.value._0_8_;
  __val = input.value._8_4_;
  if (-1 < (int)__val) {
    lVar2 = duckdb::Bit::BitLength((Bit *)this,input);
    if ((ulong)__val <= lVar2 - 1U) {
      sVar4.value._0_8_ = this;
      iVar1 = duckdb::Bit::GetBit(sVar4,(ulong)__val);
      return iVar1;
    }
  }
  this_00 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&local_40,"bit index %s out of valid range (0..%s)",&local_81);
  std::__cxx11::to_string(&local_60,__val);
  sVar3.value.pointer.ptr = (char *)extraout_RDX;
  sVar3.value._0_8_ = sVar4.value._8_8_;
  lVar2 = duckdb::Bit::BitLength((Bit *)this,sVar3);
  std::__cxx11::to_string(&local_80,lVar2 - 1);
  OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
            (this_00,&local_40,&local_60,&local_80);
  __cxa_throw(this_00,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA input, TB n) {
		if (n < 0 || (idx_t)n > Bit::BitLength(input) - 1) {
			throw OutOfRangeException("bit index %s out of valid range (0..%s)", NumericHelper::ToString(n),
			                          NumericHelper::ToString(Bit::BitLength(input) - 1));
		}
		return UnsafeNumericCast<TR>(Bit::GetBit(input, UnsafeNumericCast<idx_t>(n)));
	}